

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O3

void __thiscall cfd::core::CfdCoreManager::~CfdCoreManager(CfdCoreManager *this)

{
  pointer ppiVar1;
  pointer ppiVar2;
  
  this->_vptr_CfdCoreManager = (_func_int **)&PTR__CfdCoreManager_007311d0;
  ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppiVar1 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppiVar2 != ppiVar1) {
    do {
      Finalize(this,*ppiVar2,true);
      ppiVar2 = ppiVar2 + 1;
    } while (ppiVar2 != ppiVar1);
    ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppiVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppiVar2);
  return;
}

Assistant:

CfdCoreManager::~CfdCoreManager() {
  if (!handle_list_.empty()) {
    for (CfdCoreHandle handle : handle_list_) {
      Finalize(handle, true);
    }
  }
}